

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 02_signal_restart.c
# Opt level: O0

int main(void)

{
  int iVar1;
  ssize_t sVar2;
  undefined1 local_4a8 [8];
  char buff [1024];
  sigaction sa;
  
  sa.sa_restorer._4_4_ = 0;
  sigemptyset((sigset_t *)&sa);
  sa.sa_mask.__val[0xf]._0_4_ = 0x10000000;
  buff._1016_8_ = sigalrm_handler;
  iVar1 = sigaction(0xe,(sigaction *)(buff + 0x3f8),(sigaction *)0x0);
  if (iVar1 == -1) {
    perror("sigaction");
    exit(1);
  }
  alarm(5);
  do {
    memset(local_4a8,0,0x400);
    sVar2 = read(0,local_4a8,0x3ff);
    if (sVar2 == -1) {
      perror("read");
      exit(1);
    }
    sVar2 = write(1,local_4a8,0x400);
  } while (sVar2 != -1);
  perror("write");
  exit(1);
}

Assistant:

int main() {
    struct sigaction sa;
    char buff[1024];

    /*
     * Setup a signal handler for the SIGALRM signal
     * */
    sigemptyset(&sa.sa_mask);
    sa.sa_flags = SA_RESTART;
    sa.sa_handler = sigalrm_handler;
    if (sigaction(SIGALRM, &sa, NULL) == -1)
        handle_error("sigaction");

    /*
     * Let's send ourselves a SIGALRM signal a few
     * seconds later.
     * */
    alarm(ALARM_AFTER_SECS);

    /*
     * Infinite loop where we read from stdin and print
     * what we read back to stdout.
     * */
    while(1) {
        bzero(buff, sizeof(buff));
        if( read(STDIN_FILENO, buff, sizeof(buff)-1 ) == -1 )
            handle_error("read");
        if( write(STDOUT_FILENO, buff, sizeof(buff) ) == -1 )
            handle_error("write");
    }

    return 0;
}